

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O2

bool __thiscall
lzham::task_pool::queue_task(task_pool *this,task_callback_func pFunc,uint64 data,void *pData_ptr)

{
  bool bVar1;
  task local_30;
  
  local_30.m_flags = 0;
  local_30.m_data = data;
  local_30.m_pData_ptr = pData_ptr;
  local_30.field_2.m_callback = pFunc;
  bVar1 = tsstack<lzham::task_pool::task,_64U>::try_push(&this->m_task_stack,&local_30);
  if (bVar1) {
    LOCK();
    this->m_num_outstanding_tasks = this->m_num_outstanding_tasks + 1;
    UNLOCK();
    semaphore::release(&this->m_tasks_available,1);
  }
  return bVar1;
}

Assistant:

bool task_pool::queue_task(task_callback_func pFunc, uint64 data, void* pData_ptr)
   {
      LZHAM_ASSERT(m_num_threads);
      LZHAM_ASSERT(pFunc);

      task tsk;
      tsk.m_callback = pFunc;
      tsk.m_data = data;
      tsk.m_pData_ptr = pData_ptr;
      tsk.m_flags = 0;

      if (!m_task_stack.try_push(tsk))
         return false;

      atomic_increment32(&m_num_outstanding_tasks);

      m_tasks_available.release(1);

      return true;
   }